

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extr.c
# Opt level: O1

void extract(byte *ptr,int64_t len)

{
  byte *pbVar1;
  uint uVar2;
  long lVar3;
  int iVar4;
  uint32_t uVar5;
  byte *buf;
  ulong uVar6;
  char *__s;
  uint *puVar7;
  ulong sz;
  long lVar8;
  
  if (len < 0x40) {
    __s = "file too small";
  }
  else if ((((*ptr == '\x7f') || (ptr[1] == 'E')) || (ptr[2] == 'L')) || (ptr[3] == 'F')) {
    if (ptr[4] != '\x02') {
      printf("32 bits ELF not supported [%d]");
      return;
    }
    if (ptr[5] == '\x01') {
      if (ptr[6] == '\x01') {
        if ((ushort)(*(short *)(ptr + 0x10) - 1U) < 2) {
          if (*(ushort *)(ptr + 0x3e) != 0) {
            lVar3 = *(long *)(ptr + (ulong)*(ushort *)(ptr + 0x3e) * 0x40 + 0x18 +
                                    *(long *)(ptr + 0x28));
            if (debug != 0) {
              printf("e_type= %d\n");
              printf("e_machine= %d\n",(ulong)*(ushort *)(ptr + 0x12));
              printf("e_version= %d\n",(ulong)*(uint *)(ptr + 0x14));
              printf("e_entry= %lu\n",*(undefined8 *)(ptr + 0x18));
              printf("e_phoff= %lu\n",*(undefined8 *)(ptr + 0x20));
              printf("e_shoff= %lu\n",*(undefined8 *)(ptr + 0x28));
              printf("e_flags= %d\n",(ulong)*(uint *)(ptr + 0x30));
              printf("e_ehsize= %d\n",(ulong)*(ushort *)(ptr + 0x34));
              printf("e_phentsize= %d\n",(ulong)*(ushort *)(ptr + 0x36));
              printf("e_phnum= %d\n",(ulong)*(ushort *)(ptr + 0x38));
              printf("e_shentsize= %d\n",(ulong)*(ushort *)(ptr + 0x3a));
              printf("e_shnum= %d\n",(ulong)*(ushort *)(ptr + 0x3c));
              printf("e_shstrndx= %d\n",(ulong)*(ushort *)(ptr + 0x3e));
            }
            if (*(short *)(ptr + 0x3c) != 0) {
              uVar6 = 0;
              do {
                lVar8 = *(long *)(ptr + 0x28);
                uVar2 = *(uint *)(ptr + uVar6 * 0x40 + lVar8);
                iVar4 = strcmp((char *)(ptr + (ulong)uVar2 + lVar3),".llvmbc");
                if (iVar4 == 0) {
                  puVar7 = (uint *)(ptr + uVar6 * 0x40 + lVar8);
                  if (debug != 0) {
                    printf("%-3d %s\n",uVar6 & 0xffffffff,ptr + (ulong)uVar2 + lVar3);
                    printf("   sh_name = %u\n",(ulong)*puVar7);
                    printf("   sh_type = %u\n",(ulong)puVar7[1]);
                    printf("   sh_flags = %lu\n",*(undefined8 *)(puVar7 + 2));
                    printf("   sh_addr = %lu\n",*(undefined8 *)(puVar7 + 4));
                    printf("   sh_offset = %lu\n",*(undefined8 *)(puVar7 + 6));
                    printf("   sh_size = %lu\n",*(undefined8 *)(puVar7 + 8));
                    printf("   sh_link = %u\n",(ulong)puVar7[10]);
                    printf("   sh_info = %u\n",(ulong)puVar7[0xb]);
                    printf("   sh_addralign = %lu\n",*(undefined8 *)(puVar7 + 0xc));
                    printf("   sh_entsize = %lu\n",*(undefined8 *)(puVar7 + 0xe));
                  }
                  buf = ptr + *(long *)(puVar7 + 6);
                  for (lVar8 = *(long *)(puVar7 + 8); lVar8 != 0; lVar8 = lVar8 - sz) {
                    pbVar1 = buf + lVar8;
                    do {
                      if (*buf != '\0') goto LAB_001f01ce;
                      buf = buf + 1;
                      lVar8 = lVar8 + -1;
                    } while (lVar8 != 0);
                    lVar8 = 0;
                    buf = pbVar1;
LAB_001f01ce:
                    uVar5 = dumpbits(buf,lVar8);
                    if (uVar5 == 0) break;
                    sz = (ulong)uVar5;
                    readmod(buf,sz);
                    buf = buf + sz;
                  }
                }
                uVar6 = uVar6 + 1;
              } while (uVar6 < *(ushort *)(ptr + 0x3c));
            }
            return;
          }
          __s = "ELF file without string table";
        }
        else {
          __s = "unsupported ELF File type";
        }
      }
      else {
        __s = "unsupported ELF File version";
      }
    }
    else {
      __s = "unsupported ELF File byte order";
    }
  }
  else {
    __s = "not ELF file";
  }
  puts(__s);
  return;
}

Assistant:

void extract(byte* ptr, int64_t len) {
    Elf64_Ehdr *h;
	Elf64_Shdr *s;
	byte *bc;
	size_t sz;
	int i;
	byte c;
	char *n;

    if (len < (int64_t) sizeof(Elf64_Ehdr)) {
        printf("file too small\n");
        return;
    }
    
    h = (Elf64_Ehdr *) ptr;
	if (h->e_ident[EI_MAG0] != 0x7f &&
		h->e_ident[EI_MAG1] != 'E' &&
		h->e_ident[EI_MAG2] != 'L' &&
		h->e_ident[EI_MAG3] != 'F') {
		printf("not ELF file\n");
		return;
	}

	c = h->e_ident[EI_CLASS];
	if (c != ELFCLASS64) {
		printf("32 bits ELF not supported [%d]", c);
		return;
	}

	if (h->e_ident[EI_DATA] != ELFDATA2LSB) {
		printf("unsupported ELF File byte order\n");
		return;
	}

	if (h->e_ident[EI_VERSION] != EV_CURRENT) {
		printf("unsupported ELF File version\n");
		return;
	}

	if (h->e_type != ET_REL && h->e_type != ET_EXEC) {
		printf("unsupported ELF File type\n");
		return;
	}

	if (h->e_shstrndx == SHN_UNDEF) {
		printf("ELF file without string table\n");
		return;
	}

	s = (Elf64_Shdr *) (ptr + h->e_shoff) + h->e_shstrndx;
	n = (char *) ptr + s->sh_offset;

	if (debug) {
		printf("e_type= %d\n", h->e_type);          	/* File type. */
		printf("e_machine= %d\n", h->e_machine);        /* Machine architecture. */
		printf("e_version= %d\n", h->e_version);        /* ELF format version. */
		printf("e_entry= %lu\n", h->e_entry);			/* Entry point. */
		printf("e_phoff= %lu\n", h->e_phoff);			/* Program header file offset. */
		printf("e_shoff= %lu\n", h->e_shoff);			/* Section header file offset. */
		printf("e_flags= %d\n", h->e_flags);            /* Architecture-specific flags. */
		printf("e_ehsize= %d\n", h->e_ehsize);          /* Size of ELF header in bytes. */
		printf("e_phentsize= %d\n", h->e_phentsize);    /* Size of program header entry. */
		printf("e_phnum= %d\n", h->e_phnum);            /* Number of program header entries. */
		printf("e_shentsize= %d\n", h->e_shentsize);    /* Size of section header entry. */
		printf("e_shnum= %d\n", h->e_shnum);            /* Number of section header entries. */
		printf("e_shstrndx= %d\n", h->e_shstrndx);      /* Section name strings section. */
	}

	for (i = 0; i < h->e_shnum; i += 1) {
		s = (Elf64_Shdr *) (ptr + h->e_shoff) + i;
		if (strcmp(n + s->sh_name, ".llvmbc")) {
			continue;
		}

		if (debug) {
			printf("%-3d %s\n", i, n + s->sh_name);
			printf("   sh_name = %u\n", s->sh_name);
			printf("   sh_type = %u\n", s->sh_type);
			printf("   sh_flags = %lu\n", s->sh_flags);
			printf("   sh_addr = %lu\n", s->sh_addr);
			printf("   sh_offset = %lu\n", s->sh_offset);
			printf("   sh_size = %lu\n", s->sh_size);
			printf("   sh_link = %u\n", s->sh_link);
			printf("   sh_info = %u\n", s->sh_info);
			printf("   sh_addralign = %lu\n", s->sh_addralign);
			printf("   sh_entsize = %lu\n", s->sh_entsize);
		}

		bc = ptr + s->sh_offset;
		sz = s->sh_size;

		while (sz > 0) {
			// skip 0 padded bytes

			while (sz > 0) {
				if (bc[0] != 0) {
					break;
				}
				sz -= 1;
				bc += 1;
			}

			// get module size, if any

			uint32_t n = dumpbits(bc, sz);
			if (n == 0) {
				break;
			}

			// dump module

			readmod(bc, n);
			
			// next module

			bc += n;
			sz -= n;
		}
	}
}